

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQClosure::Save(SQClosure *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  bool bVar1;
  SQWRITEFUNC in_RCX;
  HSQUIRRELVM in_RDX;
  SQUserPointer in_RDI;
  SQVM *in_stack_00000030;
  SQFunctionProto *in_stack_00000038;
  SQUnsignedInteger32 in_stack_ffffffffffffffcc;
  undefined1 local_1;
  
  bVar1 = WriteTag(in_RDX,in_RCX,in_RDI,in_stack_ffffffffffffffcc);
  if (bVar1) {
    bVar1 = WriteTag(in_RDX,in_RCX,in_RDI,in_stack_ffffffffffffffcc);
    if (bVar1) {
      bVar1 = WriteTag(in_RDX,in_RCX,in_RDI,in_stack_ffffffffffffffcc);
      if (bVar1) {
        bVar1 = WriteTag(in_RDX,in_RCX,in_RDI,in_stack_ffffffffffffffcc);
        if (bVar1) {
          bVar1 = SQFunctionProto::Save(in_stack_00000038,in_stack_00000030,this,(SQWRITEFUNC)v);
          if (bVar1) {
            bVar1 = WriteTag(in_RDX,in_RCX,in_RDI,in_stack_ffffffffffffffcc);
            if (bVar1) {
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQClosure::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQChar)));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQInteger)));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQFloat)));
    _CHECK_IO(_function->Save(v,up,write));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_TAIL));
    return true;
}